

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Amd.h
# Opt level: O2

int Eigen::internal::cs_wclear<int>(int mark,int lemax,int *w,int n)

{
  ulong uVar1;
  ulong uVar2;
  
  if (lemax + mark < 0 || mark < 2) {
    uVar2 = 0;
    uVar1 = (ulong)(uint)n;
    if (n < 1) {
      uVar1 = uVar2;
    }
    mark = 2;
    for (; uVar1 != uVar2; uVar2 = uVar2 + 1) {
      if (w[uVar2] != 0) {
        w[uVar2] = 1;
      }
    }
  }
  return mark;
}

Assistant:

static StorageIndex cs_wclear (StorageIndex mark, StorageIndex lemax, StorageIndex *w, StorageIndex n)
{
  StorageIndex k;
  if(mark < 2 || (mark + lemax < 0))
  {
    for(k = 0; k < n; k++)
      if(w[k] != 0)
        w[k] = 1;
    mark = 2;
  }
  return (mark);     /* at this point, w[0..n-1] < mark holds */
}